

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_map_field.cc
# Opt level: O1

char * google::protobuf::compiler::objectivec::anon_unknown_10::MapEntryTypeName
                 (FieldDescriptor *descriptor,bool isKey)

{
  Type field_type;
  ObjectiveCType OVar1;
  char *pcVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  field_type = FieldDescriptor::type(descriptor);
  OVar1 = GetObjectiveCType(field_type);
  switch(OVar1) {
  case OBJECTIVECTYPE_INT32:
    pcVar2 = "Int32";
    break;
  case OBJECTIVECTYPE_UINT32:
    pcVar2 = "UInt32";
    break;
  case OBJECTIVECTYPE_INT64:
    pcVar2 = "Int64";
    break;
  case OBJECTIVECTYPE_UINT64:
    pcVar2 = "UInt64";
    break;
  case OBJECTIVECTYPE_FLOAT:
    pcVar2 = "Float";
    break;
  case OBJECTIVECTYPE_DOUBLE:
    pcVar2 = "Double";
    break;
  case OBJECTIVECTYPE_BOOLEAN:
    pcVar2 = "Bool";
    break;
  case OBJECTIVECTYPE_STRING:
    pcVar2 = "Object";
    if (isKey) {
      pcVar2 = "String";
    }
    break;
  case OBJECTIVECTYPE_DATA:
  case OBJECTIVECTYPE_MESSAGE:
    pcVar2 = "Object";
    break;
  case OBJECTIVECTYPE_ENUM:
    pcVar2 = "Enum";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_map_field.cc"
               ,0x51);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* MapEntryTypeName(const FieldDescriptor* descriptor, bool isKey) {
  ObjectiveCType type = GetObjectiveCType(descriptor);
  switch (type) {
    case OBJECTIVECTYPE_INT32:
      return "Int32";
    case OBJECTIVECTYPE_UINT32:
      return "UInt32";
    case OBJECTIVECTYPE_INT64:
      return "Int64";
    case OBJECTIVECTYPE_UINT64:
      return "UInt64";
    case OBJECTIVECTYPE_FLOAT:
      return "Float";
    case OBJECTIVECTYPE_DOUBLE:
      return "Double";
    case OBJECTIVECTYPE_BOOLEAN:
      return "Bool";
    case OBJECTIVECTYPE_STRING:
      return (isKey ? "String" : "Object");
    case OBJECTIVECTYPE_DATA:
      return "Object";
    case OBJECTIVECTYPE_ENUM:
      return "Enum";
    case OBJECTIVECTYPE_MESSAGE:
      return "Object";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}